

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerHasName::operator()
          (TrackerHasName *this,Ptr<Catch::TestCaseTracking::ITracker> *tracker)

{
  size_t __n;
  char *__s1;
  char *__s2;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(tracker->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[4])();
  __n = ((undefined8 *)CONCAT44(extraout_var,iVar1))[1];
  if ((__n == (this->m_nameAndLocation).name._M_string_length) &&
     ((__n == 0 ||
      (iVar1 = bcmp(*(void **)CONCAT44(extraout_var,iVar1),
                    (this->m_nameAndLocation).name._M_dataplus._M_p,__n), iVar1 == 0)))) {
    iVar1 = (*(tracker->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[4])();
    if (*(size_t *)(CONCAT44(extraout_var_00,iVar1) + 0x28) ==
        (this->m_nameAndLocation).location.line) {
      __s1 = *(char **)(CONCAT44(extraout_var_00,iVar1) + 0x20);
      __s2 = (this->m_nameAndLocation).location.file;
      if (__s1 != __s2) {
        iVar1 = strcmp(__s1,__s2);
        return iVar1 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool operator ()( Ptr<ITracker> const& tracker ) {
                return
                    tracker->nameAndLocation().name == m_nameAndLocation.name &&
                    tracker->nameAndLocation().location == m_nameAndLocation.location;
            }